

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

int Fra_ImpCheckForNode(Fra_Man_t *p,Vec_Int_t *vImps,Aig_Obj_t *pNode,int Pos)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint uVar7;
  uint uVar8;
  uint fComplR;
  
  do {
    if (vImps->nSize <= Pos) {
      return Pos;
    }
    uVar3 = Vec_IntEntry(vImps,Pos);
    if (uVar3 != 0) {
      uVar8 = uVar3 & 0xffff;
      uVar3 = (int)uVar3 >> 0x10;
      uVar7 = uVar3;
      if ((int)uVar3 < (int)uVar8) {
        uVar7 = uVar8;
      }
      if ((int)uVar7 < pNode->Id) {
        __assert_fail("Max >= pNode->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraImp.c"
                      ,0x204,"int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
      }
      if (pNode->Id < (int)uVar7) {
        return Pos;
      }
      pAVar5 = Aig_ManObj(p->pManAig,uVar8);
      pAVar6 = Aig_ManObj(p->pManAig,uVar3);
      iVar4 = p->pPars->nFramesK;
      uVar1 = *(ulong *)(*(long *)((long)(pAVar5->field_5).pData + 0x20) +
                        (long)(pAVar5->Id * *(int *)((long)(pAVar5->field_5).pData + 0x18) + iVar4)
                        * 8);
      uVar2 = *(ulong *)(*(long *)((long)(pAVar6->field_5).pData + 0x20) +
                        (long)(pAVar6->Id * *(int *)((long)(pAVar6->field_5).pData + 0x18) + iVar4)
                        * 8);
      uVar8 = *(uint *)&pAVar5->field_0x18 >> 3 & 1;
      uVar3 = (uint)uVar1 & 1;
      uVar7 = uVar8 ^ uVar3;
      fComplR = ((uint)uVar2 ^ *(uint *)&pAVar6->field_0x18 >> 3) & 1;
      pAVar6 = (Aig_Obj_t *)(uVar1 & 0xfffffffffffffffe);
      pAVar5 = (Aig_Obj_t *)(uVar2 & 0xfffffffffffffffe);
      if (pAVar6 == pAVar5) {
        if ((uVar7 != fComplR) && (((*(uint *)&pAVar6->field_0x18 & 7) != 1 || (uVar8 == uVar3)))) {
          p->pCla->fRefinement = 1;
          Vec_IntWriteEntry(vImps,Pos,0);
        }
      }
      else {
        iVar4 = Fra_NodesAreImp(p,pAVar6,pAVar5,uVar7,fComplR);
        if (iVar4 != 1) {
          p->pCla->fRefinement = 1;
          if (iVar4 == 0) {
            Fra_SmlResimulate(p);
          }
          iVar4 = Vec_IntEntry(vImps,Pos);
          if (iVar4 != 0) {
            puts("Fra_ImpCheckForNode(): Implication is not refined!");
          }
          iVar4 = Vec_IntEntry(vImps,Pos);
          if (iVar4 != 0) {
            __assert_fail("Vec_IntEntry(vImps, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraImp.c"
                          ,0x22e,
                          "int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
          }
        }
      }
    }
    Pos = Pos + 1;
  } while( true );
}

Assistant:

int Fra_ImpCheckForNode( Fra_Man_t * p, Vec_Int_t * vImps, Aig_Obj_t * pNode, int Pos )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, Imp, Left, Right, Max, RetValue;
    int fComplL, fComplR;
    Vec_IntForEachEntryStart( vImps, Imp, i, Pos )
    {
        if ( Imp == 0 )
            continue;
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Max = Abc_MaxInt( Left, Right );
        assert( Max >= pNode->Id );
        if ( Max > pNode->Id )
            return i;
        // get the corresponding nodes
        pLeft  = Aig_ManObj( p->pManAig, Left );
        pRight = Aig_ManObj( p->pManAig, Right );
        // get the corresponding FRAIG nodes
        pLeftF  = Fra_ObjFraig( pLeft, p->pPars->nFramesK );
        pRightF = Fra_ObjFraig( pRight, p->pPars->nFramesK );
        // get the complemented attributes
        fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
        fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
        // check equality
        if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
        {
            if ( fComplL == fComplR ) // x => x  - always true
                continue;
            assert( fComplL != fComplR );
            // consider 4 possibilities:
            // NOT(1) => 1    or   0 => 1  - always true
            // 1 => NOT(1)    or   1 => 0  - never true
            // NOT(x) => x    or   x       - not always true
            // x => NOT(x)    or   NOT(x)  - not always true
            if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                continue;
            // disproved implication
            p->pCla->fRefinement = 1;
            Vec_IntWriteEntry( vImps, i, 0 );
            continue;
        }
        // check the implication 
        // - if true, a clause is added
        // - if false, a cex is simulated
        // make sure the implication is refined
        RetValue = Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vImps, i) != 0 )
                printf( "Fra_ImpCheckForNode(): Implication is not refined!\n" );
            assert( Vec_IntEntry(vImps, i) == 0 );
        }
    }
    return i;
}